

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p_stream.hpp
# Opt level: O1

void __thiscall
libtorrent::i2p_connection::
on_name_lookup<std::function<void(boost::system::error_code_const&,char_const*)>>
          (i2p_connection *this,error_code *ec,shared_ptr<libtorrent::i2p_stream> *param_2,
          function<void_(const_boost::system::error_code_&,_const_char_*)> *handler)

{
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
  *this_00;
  element_type *peVar1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  string name;
  long *local_70;
  _Any_data local_68;
  _List_node_base *local_58;
  _List_node_base *local_50;
  long *local_48 [2];
  long local_38 [2];
  
  this->m_state = sam_idle;
  peVar1 = (this->m_sam_socket).
           super___shared_ptr<libtorrent::i2p_stream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pcVar2 = (peVar1->m_name_lookup)._M_dataplus._M_p;
  local_48[0] = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar2,pcVar2 + (peVar1->m_name_lookup)._M_string_length);
  this_00 = &this->m_name_lookup;
  p_Var3 = (this->m_name_lookup).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)this_00) {
    local_68._M_unused._M_object = (_List_node_base *)0x0;
    local_68._8_8_ = (_List_node_base *)0x0;
    local_58 = (_List_node_base *)0x0;
    local_50 = p_Var3[4]._M_prev;
    p_Var4 = p_Var3[4]._M_next;
    if (p_Var4 != (_List_node_base *)0x0) {
      local_68._M_unused._M_object = p_Var3[3]._M_next;
      local_68._8_8_ = p_Var3[3]._M_prev;
      p_Var3[4]._M_next = (_List_node_base *)0x0;
      p_Var3[4]._M_prev = (_List_node_base *)0x0;
      local_58 = p_Var4;
    }
    do_name_lookup<std::function<void(boost::system::error_code_const&,char_const*)>>
              (this,(string *)(p_Var3 + 1),
               (function<void_(const_boost::system::error_code_&,_const_char_*)> *)&local_68);
    if (local_58 != (_List_node_base *)0x0) {
      (*(code *)local_58)(&local_68,&local_68,__destroy_functor);
    }
    ::std::__cxx11::
    list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
    ::_M_erase(this_00,(this_00->
                       super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_char_*)>_>_>_>
                       )._M_impl._M_node.super__List_node_base._M_next);
  }
  if (ec->failed_ == true) {
    local_70 = (long *)0x0;
    if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_001de632:
      ::std::__throw_bad_function_call();
    }
    (*handler->_M_invoker)((_Any_data *)handler,ec,(char **)&local_70);
  }
  else {
    local_70 = local_48[0];
    if ((handler->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_001de632;
    (*handler->_M_invoker)((_Any_data *)handler,ec,(char **)&local_70);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return;
}

Assistant:

void on_name_lookup(error_code const& ec, std::shared_ptr<i2p_stream>, Handler handler)
	{
		m_state = sam_idle;

		std::string name = m_sam_socket->name_lookup();
		if (!m_name_lookup.empty())
		{
			std::pair<std::string, name_lookup_handler>& nl = m_name_lookup.front();
			do_name_lookup(nl.first, std::move(nl.second));
			m_name_lookup.pop_front();
		}

		if (ec)
		{
			handler(ec, nullptr);
			return;
		}

		handler(ec, name.c_str());
	}